

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gds2writer.cpp
# Opt level: O2

void __thiscall GDS2Writer::writeHeader(GDS2Writer *this)

{
  ushort uVar1;
  
  writeUint16(this,6);
  writeUint16(this,2);
  writeUint16(this,3);
  writeUint16(this,0x1c);
  writeUint16(this,0x102);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0x12);
  writeUint16(this,0x206);
  writeUint16(this,0x4141);
  writeUint16(this,0x4141);
  writeUint16(this,0x4141);
  writeUint16(this,0x4141);
  writeUint16(this,0x4141);
  writeUint16(this,0x4141);
  writeUint16(this,0x4141);
  writeUint16(this,0x14);
  writeUint16(this,0x305);
  writeUint32(this,0x3e418937);
  writeUint32(this,0x4bc6a7ef);
  writeUint32(this,0x3944b82f);
  writeUint32(this,0xa09b5a54);
  writeUint16(this,0x1c);
  writeUint16(this,0x502);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  writeUint16(this,0);
  uVar1 = (ushort)(int)(this->m_designName)._M_string_length;
  writeUint16(this,uVar1 + (uVar1 & 1) + 4);
  writeUint16(this,0x606);
  writeString(this,&this->m_designName);
  return;
}

Assistant:

void GDS2Writer::writeHeader()
{
    // HEADER record
    writeUint16(0x0006);    // Len = 6 bytes
    writeUint16(0x0002);    // HEADER id
    writeUint16(0x0003);    // version 3?

    // BGNLIB
    writeUint16(0x001C);    // Len
    writeUint16(0x0102);    // BGNLIB id
    writeUint16(0x0000);    // year (last modified)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second
    writeUint16(0x0000);    // year (last accessed)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second    

    // LIBNAME
    writeUint16(0x0012);    // Len 18
    writeUint16(0x0206);    // LIBNAME id
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);
    writeUint16(0x4141);

    // UNITS
    writeUint16(0x0014);     // two 8-byte real
    writeUint16(0x0305);    // UNITS id
    writeUint32(0x3E418937);
    writeUint32(0x4BC6A7EF);    
    writeUint32(0x3944B82F);
    writeUint32(0xA09B5A54);    
    
    // BGNSTR
    writeUint16(0x001C);    // Len
    writeUint16(0x0502);    // BGNSTR id
    writeUint16(0x0000);    // year (last modified)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second
    writeUint16(0x0000);    // year (last accessed)
    writeUint16(0x0000);    // month
    writeUint16(0x0000);    // day
    writeUint16(0x0000);    // hour
    writeUint16(0x0000);    // minute
    writeUint16(0x0000);    // second

    // STRNAME 
    uint32_t bytes = m_designName.size() + (m_designName.size() % 2);
    writeUint16(bytes+4);   // Len
    writeUint16(0x0606);    // STRNAME id
    writeString(m_designName);
}